

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O0

void __thiscall
Diligent::VariableSizeAllocationsManager::~VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this)

{
  bool bVar1;
  size_type sVar2;
  Char *pCVar3;
  pointer ppVar4;
  size_type sVar5;
  pointer ppVar6;
  VariableSizeAllocationsManager *Args_1;
  undefined1 local_148 [8];
  string msg_7;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
  local_120;
  undefined1 local_118 [8];
  string msg_6;
  undefined1 local_f0 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
  local_88;
  undefined1 local_80 [8];
  string msg_2;
  undefined1 local_58 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VariableSizeAllocationsManager *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = std::
          map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
          ::empty(&this->m_FreeBlocksByOffset);
  if ((!bVar1) ||
     (bVar1 = std::
              multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
              ::empty(&this->m_FreeBlocksBySize), !bVar1)) {
    sVar2 = std::
            map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_FreeBlocksByOffset);
    if (sVar2 != 1) {
      FormatString<char[30]>((string *)local_30,(char (*) [30])"Single free block is expected");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x88);
      std::__cxx11::string::~string((string *)local_30);
    }
    msg_1.field_2._8_8_ =
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksByOffset);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                           *)((long)&msg_1.field_2 + 8));
    if (ppVar4->first != 0) {
      FormatString<char[38]>
                ((string *)local_58,(char (*) [38])"Head chunk offset is expected to be 0");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x89);
      std::__cxx11::string::~string((string *)local_58);
    }
    msg_2.field_2._8_8_ =
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksByOffset);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
                           *)((long)&msg_2.field_2 + 8));
    Args_1 = this;
    if ((ppVar4->second).Size != this->m_MaxSize) {
      FormatString<char[35],unsigned_long>
                ((string *)local_80,(Diligent *)"Head chunk size is expected to be ",
                 (char (*) [35])&this->m_MaxSize,(unsigned_long *)this);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      Args_1 = (VariableSizeAllocationsManager *)0x8a;
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x8a);
      std::__cxx11::string::~string((string *)local_80);
    }
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksByOffset);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>
             ::operator->(&local_88);
    msg_3.field_2._8_8_ =
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksBySize);
    bVar1 = std::operator==(&(ppVar4->second).OrderBySizeIt,(_Self *)((long)&msg_3.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      FormatString<char[26],char[81]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "m_FreeBlocksByOffset.begin()->second.OrderBySizeIt == m_FreeBlocksBySize.begin()",
                 (char (*) [81])Args_1);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x8b);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    sVar5 = std::
            multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_FreeBlocksBySize);
    sVar2 = std::
            map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_FreeBlocksByOffset);
    if (sVar5 != sVar2) {
      FormatString<char[36]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [36])"Sizes of the two maps must be equal");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x8c);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    sVar5 = std::
            multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
            ::size(&this->m_FreeBlocksBySize);
    if (sVar5 != 1) {
      FormatString<char[30]>((string *)local_f0,(char (*) [30])"Single free block is expected");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x8e);
      std::__cxx11::string::~string((string *)local_f0);
    }
    msg_6.field_2._8_8_ =
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksBySize);
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
                           *)((long)&msg_6.field_2 + 8));
    if (ppVar6->first != this->m_MaxSize) {
      FormatString<char[35],unsigned_long>
                ((string *)local_118,(Diligent *)"Head chunk size is expected to be ",
                 (char (*) [35])&this->m_MaxSize,(unsigned_long *)this);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x8f);
      std::__cxx11::string::~string((string *)local_118);
    }
    local_120._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksBySize);
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>
             ::operator->(&local_120);
    msg_7.field_2._8_8_ =
         std::
         map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
         ::begin(&this->m_FreeBlocksByOffset);
    bVar1 = std::operator==(&ppVar6->second,(_Self *)((long)&msg_7.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      FormatString<char[22]>((string *)local_148,(char (*) [22])"Incorrect first block");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"~VariableSizeAllocationsManager",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x90);
      std::__cxx11::string::~string((string *)local_148);
    }
  }
  std::
  multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
  ::~multimap(&this->m_FreeBlocksBySize);
  std::
  map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
  ::~map(&this->m_FreeBlocksByOffset);
  return;
}

Assistant:

~VariableSizeAllocationsManager()
    {
#ifdef DILIGENT_DEBUG
        if (!m_FreeBlocksByOffset.empty() || !m_FreeBlocksBySize.empty())
        {
            VERIFY(m_FreeBlocksByOffset.size() == 1, "Single free block is expected");
            VERIFY(m_FreeBlocksByOffset.begin()->first == 0, "Head chunk offset is expected to be 0");
            VERIFY(m_FreeBlocksByOffset.begin()->second.Size == m_MaxSize, "Head chunk size is expected to be ", m_MaxSize);
            VERIFY_EXPR(m_FreeBlocksByOffset.begin()->second.OrderBySizeIt == m_FreeBlocksBySize.begin());
            VERIFY(m_FreeBlocksBySize.size() == m_FreeBlocksByOffset.size(), "Sizes of the two maps must be equal");

            VERIFY(m_FreeBlocksBySize.size() == 1, "Single free block is expected");
            VERIFY(m_FreeBlocksBySize.begin()->first == m_MaxSize, "Head chunk size is expected to be ", m_MaxSize);
            VERIFY(m_FreeBlocksBySize.begin()->second == m_FreeBlocksByOffset.begin(), "Incorrect first block");
        }
#endif
    }